

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::SizeStatistics::~SizeStatistics(SizeStatistics *this)

{
  ~SizeStatistics(this);
  operator_delete(this);
  return;
}

Assistant:

SizeStatistics::~SizeStatistics() noexcept {
}